

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::SmallInteger::stBitShift(InterpreterProxy *interpreter)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  long lVar6;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar4 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  if (((uVar3 & 1) != 0) && ((uVar4 & 1) != 0)) {
    lVar6 = CONCAT44(extraout_var_00,uVar3) >> 1;
    lVar5 = CONCAT44(extraout_var_01,uVar4) >> 1;
    bVar1 = (byte)lVar5;
    if (lVar5 < 0) {
      lVar6 = lVar6 >> (-bVar1 & 0x3f);
    }
    else {
      lVar6 = lVar6 << (bVar1 & 0x3f);
    }
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x16])(interpreter,lVar6);
    return iVar2;
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar2;
}

Assistant:

int SmallInteger::stBitShift(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    if(ib < 0)
        return interpreter->returnInteger(ia >> SmallIntegerValue(-ib));
    return interpreter->returnInteger(ia << ib);
}